

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

uchar b64reverse(char letter)

{
  byte bVar1;
  
  bVar1 = letter + 0xbf;
  if (0x19 < bVar1) {
    if ((byte)(letter + 0x9fU) < 0x1a) {
      bVar1 = letter + 0xb9;
    }
    else {
      if (9 < (byte)(letter - 0x30U)) {
        if (letter == '+') {
          return '>';
        }
        if (letter == '=') {
          return 0xff;
        }
        if (letter != '/') {
          return 0xfe;
        }
        return '?';
      }
      bVar1 = letter + 4;
    }
  }
  return bVar1;
}

Assistant:

static unsigned char
b64reverse(char letter)
{
	if ((letter >= 'A') && (letter <= 'Z')) {
		return (unsigned char)(letter - 'A');
	}
	if ((letter >= 'a') && (letter <= 'z')) {
		return (unsigned char)(letter - 'a' + 26);
	}
	if ((letter >= '0') && (letter <= '9')) {
		return (unsigned char)(letter - '0' + 52);
	}
	if (letter == '+') {
		return 62;
	}
	if (letter == '/') {
		return 63;
	}
	if (letter == '=') {
		return 255; /* normal end */
	}
	return 254; /* error */
}